

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache(QGraphicsSceneBspTreeIndexPrivate *this)

{
  qreal *pqVar1;
  long lVar2;
  double dVar3;
  long *plVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  int *piVar7;
  undefined1 *puVar8;
  iterator __first;
  iterator __last;
  ulong uVar9;
  QGraphicsItem **ppQVar10;
  iterator iVar11;
  QGraphicsItem *pQVar12;
  value_type __val_1;
  iterator iVar13;
  QGraphicsItem **ppQVar14;
  iterator __i;
  QGraphicsItem **ppQVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  QGraphicsItemPrivate *pQVar19;
  long lVar20;
  size_t __n;
  value_type __val;
  undefined1 *puVar21;
  long in_FS_OFFSET;
  bool bVar22;
  bool bVar23;
  int stackingOrder;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  QList<QGraphicsItem_*> local_68;
  int local_44;
  QGraphicsItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = *(long **)&(this->super_QGraphicsSceneIndexPrivate).field_0x8;
  _q_updateIndex(this);
  if ((this->sortCacheEnabled == true) && (this->updatingSortCache == true)) {
    this->updatingSortCache = false;
    local_44 = 0;
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (QGraphicsItem **)0x0;
    local_68.d.size = 0;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = 0xaaaaaaaa;
    uStack_84 = 0xaaaaaaaa;
    uStack_80 = 0xaaaaaaaa;
    uStack_7c = 0xaaaaaaaa;
    (**(code **)(*plVar4 + 0x60))(&local_88,plVar4,1);
    if (local_78 != (undefined1 *)0x0) {
      puVar21 = (undefined1 *)0x0;
      puVar8 = local_78;
      do {
        pQVar5 = *(QGraphicsItem **)(CONCAT44(uStack_7c,uStack_80) + (long)puVar21 * 8);
        if ((pQVar5 != (QGraphicsItem *)0x0) &&
           (((pQVar5->d_ptr).d)->parent == (QGraphicsItem *)0x0)) {
          local_40 = pQVar5;
          QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                    ((QPodArrayOps<QGraphicsItem*> *)&local_68,local_68.d.size,&local_40);
          QList<QGraphicsItem_*>::end(&local_68);
          puVar8 = local_78;
        }
        puVar21 = puVar21 + 1;
      } while (puVar21 < puVar8);
    }
    __first = QList<QGraphicsItem_*>::begin(&local_68);
    __last = QList<QGraphicsItem_*>::end(&local_68);
    if (__first.i != __last.i) {
      uVar9 = (long)__last.i - (long)__first.i >> 3;
      lVar18 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (__first,__last,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x62558a);
      ppQVar15 = __first.i + 1;
      iVar11 = __first;
      if (0x80 < (long)__last.i - (long)__first.i) {
        __n = 8;
        do {
          ppQVar14 = __first.i + __n;
          pQVar5 = *(QGraphicsItem **)((long)__first.i + __n);
          pQVar6 = (pQVar5->d_ptr).d;
          pQVar19 = ((*__first.i)->d_ptr).d;
          uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
          uVar16 = (uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1;
          if (uVar16 == (uint)(uVar9 >> 0x28)) {
            dVar3 = pQVar6->z;
            pqVar1 = &pQVar19->z;
            if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
              if (pQVar6->siblingIndex <= pQVar19->siblingIndex) goto LAB_00623653;
              goto LAB_00623688;
            }
            if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_00623688;
LAB_00623653:
            pQVar12 = *iVar11.i;
            pQVar19 = (pQVar12->d_ptr).d;
            uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
            iVar13.i = ppQVar14;
            if (uVar16 != (uint)(uVar9 >> 0x28)) goto LAB_00623733;
            dVar3 = pQVar6->z;
            pqVar1 = &pQVar19->z;
            bVar23 = dVar3 == *pqVar1;
            bVar22 = dVar3 < *pqVar1;
            if ((bVar23) && (!NAN(dVar3) && !NAN(*pqVar1))) {
              iVar17 = pQVar6->siblingIndex;
              goto LAB_00623729;
            }
            while (ppQVar10 = iVar11.i, !bVar22 && !bVar23) {
              while( true ) {
                while( true ) {
                  ppQVar10[1] = pQVar12;
                  iVar11.i = ppQVar10 + -1;
                  pQVar12 = ppQVar10[-1];
                  pQVar6 = (pQVar5->d_ptr).d;
                  pQVar19 = (pQVar12->d_ptr).d;
                  uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
                  iVar13.i = ppQVar10;
                  if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar9 >> 0x28)) break;
LAB_00623733:
                  ppQVar10 = iVar11.i;
                  if (uVar9 == 0) goto LAB_006236c0;
                }
                dVar3 = pQVar6->z;
                pqVar1 = &pQVar19->z;
                bVar23 = dVar3 == *pqVar1;
                bVar22 = dVar3 < *pqVar1;
                if ((!bVar23) || (NAN(dVar3) || NAN(*pqVar1))) break;
                iVar17 = pQVar6->siblingIndex;
LAB_00623729:
                ppQVar10 = iVar11.i;
                if (iVar17 <= pQVar19->siblingIndex) goto LAB_006236c0;
              }
            }
          }
          else {
            if (uVar9 == 0) goto LAB_00623653;
LAB_00623688:
            memmove(ppQVar15,__first.i,__n);
            iVar13 = __first;
          }
LAB_006236c0:
          *iVar13.i = pQVar5;
          __n = __n + 8;
          iVar11.i = ppQVar14;
        } while (__n != 0x80);
        ppQVar15 = __first.i + 0x10;
LAB_0062395f:
        if (ppQVar15 != __last.i) {
          pQVar12 = ppQVar15[-1];
          pQVar5 = *ppQVar15;
          pQVar6 = (pQVar5->d_ptr).d;
          pQVar19 = (pQVar12->d_ptr).d;
          uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
          ppQVar14 = ppQVar15;
          if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
              (uint)(uVar9 >> 0x28)) {
            dVar3 = pQVar6->z;
            pqVar1 = &pQVar19->z;
            if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
              if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_006239d2;
            }
            else if (pQVar19->siblingIndex < pQVar6->siblingIndex) {
LAB_006239d2:
              do {
                *ppQVar14 = pQVar12;
                pQVar12 = ppQVar14[-2];
                pQVar6 = (pQVar5->d_ptr).d;
                pQVar19 = (pQVar12->d_ptr).d;
                uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                    (uint)(uVar9 >> 0x28)) {
                  dVar3 = pQVar6->z;
                  pqVar1 = &pQVar19->z;
                  if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                    if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_00623a33;
                  }
                  else if (pQVar6->siblingIndex <= pQVar19->siblingIndex) goto LAB_00623a33;
                }
                else if (uVar9 == 0) goto LAB_00623a33;
                ppQVar14 = ppQVar14 + -1;
              } while( true );
            }
          }
          else if (uVar9 != 0) goto LAB_006239d2;
          goto LAB_00623a37;
        }
        goto LAB_006238c2;
      }
      for (; ppQVar15 != __last.i; ppQVar15 = ppQVar15 + 1) {
        pQVar5 = *ppQVar15;
        pQVar6 = (pQVar5->d_ptr).d;
        pQVar19 = ((*__first.i)->d_ptr).d;
        uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
        uVar16 = (uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1;
        if (uVar16 == (uint)(uVar9 >> 0x28)) {
          dVar3 = pQVar6->z;
          pqVar1 = &pQVar19->z;
          if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
            if (pQVar6->siblingIndex <= pQVar19->siblingIndex) goto LAB_00623797;
            goto LAB_006237d2;
          }
          if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_006237d2;
LAB_00623797:
          pQVar12 = *iVar11.i;
          pQVar19 = (pQVar12->d_ptr).d;
          uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
          ppQVar14 = iVar11.i;
          ppQVar10 = ppQVar15;
          if (uVar16 != (uint)(uVar9 >> 0x28)) goto joined_r0x00623814;
          dVar3 = pQVar6->z;
          pqVar1 = &pQVar19->z;
          iVar13.i = ppQVar15;
          ppQVar10 = iVar11.i;
          if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
            if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_00623847;
          }
          else if (pQVar19->siblingIndex < pQVar6->siblingIndex) {
LAB_00623847:
            do {
              while( true ) {
                ppQVar10[1] = pQVar12;
                ppQVar14 = ppQVar10 + -1;
                pQVar12 = ppQVar10[-1];
                pQVar6 = (pQVar5->d_ptr).d;
                pQVar19 = (pQVar12->d_ptr).d;
                uVar9 = *(ulong *)&pQVar19->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) !=
                    (uint)(uVar9 >> 0x28)) break;
                dVar3 = pQVar6->z;
                pqVar1 = &pQVar19->z;
                iVar13.i = ppQVar10;
                ppQVar10 = ppQVar14;
                if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                  if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_006238ae;
                }
                else if (pQVar6->siblingIndex <= pQVar19->siblingIndex) goto LAB_006238ae;
              }
joined_r0x00623814:
              iVar13.i = ppQVar10;
              ppQVar10 = ppQVar14;
            } while (uVar9 != 0);
          }
        }
        else {
          if (uVar9 == 0) goto LAB_00623797;
LAB_006237d2:
          lVar18 = (long)ppQVar15 - (long)__first.i >> 3;
          iVar13 = __first;
          if (0 < lVar18) {
            lVar20 = 1;
            do {
              iVar11.i[lVar20] = iVar11.i[lVar20 + -1];
              lVar2 = lVar18 + lVar20;
              lVar20 = lVar20 + -1;
            } while (1 < lVar2 - 1U);
          }
        }
LAB_006238ae:
        *iVar13.i = pQVar5;
        iVar11.i = iVar11.i + 1;
      }
    }
LAB_006238c2:
    if (local_68.d.size != 0) {
      uVar9 = 0;
      do {
        climbTree(local_68.d.ptr[uVar9],&local_44);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)local_68.d.size);
    }
    piVar7 = (int *)CONCAT44(uStack_84,local_88);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),8,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00623a33:
  ppQVar14 = ppQVar14 + -1;
LAB_00623a37:
  *ppQVar14 = pQVar5;
  ppQVar15 = ppQVar15 + 1;
  goto LAB_0062395f;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache()
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    _q_updateIndex();

    if (!sortCacheEnabled || !updatingSortCache)
        return;

    updatingSortCache = false;
    int stackingOrder = 0;

    QList<QGraphicsItem *> topLevels;
    const QList<QGraphicsItem *> items = q->items();
    for (int i = 0; i < items.size(); ++i) {
        QGraphicsItem *item = items.at(i);
        if (item && !item->d_ptr->parent)
            topLevels << item;
    }

    std::sort(topLevels.begin(), topLevels.end(), qt_closestLeaf);
    for (int i = 0; i < topLevels.size(); ++i)
        climbTree(topLevels.at(i), &stackingOrder);
}